

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::RealMath2Function<&hypot>::eval
          (RealMath2Function<&hypot> *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  ConstantValue *in_RDI;
  real_t real;
  double __y;
  double result;
  ConstantValue b;
  ConstantValue a;
  ConstantValue *in_stack_ffffffffffffff18;
  EvalContext *in_stack_ffffffffffffff20;
  Expression *in_stack_ffffffffffffff28;
  real_t local_b0;
  real_t local_a8;
  real_t local_a0;
  double local_98;
  undefined4 local_90;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_30;
  
  local_30 = in_RCX;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](local_30,1);
  Expression::eval(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x94f8bb);
  if ((bVar1) &&
     (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x94f8d5), bVar1)) {
    local_a0 = slang::ConstantValue::real(in_stack_ffffffffffffff18);
    real.v = real_t::operator_cast_to_double(&local_a0);
    local_a8 = slang::ConstantValue::real(in_stack_ffffffffffffff18);
    __y = real_t::operator_cast_to_double(&local_a8);
    local_98 = hypot(real.v,__y);
    real_t::real_t(&local_b0,local_98);
    slang::ConstantValue::ConstantValue(in_stack_ffffffffffffff18,real);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  local_90 = 1;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x94f9d5);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x94f9e2);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        ConstantValue a = args[0]->eval(context);
        ConstantValue b = args[1]->eval(context);
        if (!a || !b)
            return nullptr;

        double result = Func(a.real(), b.real());
        return real_t(result);
    }